

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSet::serialize(UnicodeSet *this,uint16_t *dest,int32_t destCapacity,UErrorCode *ec)

{
  uint16_t uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  long lVar7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar5 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (dest == (uint16_t *)0x0 && destCapacity != 0)) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      return iVar5;
    }
    uVar12 = this->len - 1;
    if (uVar12 == 0) {
      if (destCapacity == 0) {
        *ec = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *dest = 0;
      }
      return 1;
    }
    puVar9 = (uint16_t *)this->list;
    uVar10 = uVar12;
    if (0xffff < *(int *)(puVar9 + (long)this->len * 2 + -4)) {
      if (*(int *)puVar9 < 0x10000) {
        uVar11 = 0;
        uVar13 = 0;
        if (0 < (int)uVar12) {
          uVar13 = (ulong)uVar12;
        }
        for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          if (0xffff < *(int *)(puVar9 + uVar11 * 2)) {
            uVar13 = uVar11 & 0xffffffff;
            break;
          }
        }
        iVar4 = uVar12 * 2;
        uVar12 = (uint)uVar13;
        uVar10 = iVar4 - (uint)uVar13;
      }
      else {
        uVar10 = uVar12 * 2;
        uVar12 = 0;
      }
    }
    if (0x7fff < (int)uVar10) {
      *ec = U_INDEX_OUTOFBOUNDS_ERROR;
      return iVar5;
    }
    iVar5 = ((int)uVar12 < (int)uVar10) + uVar10 + 1;
    if (destCapacity < iVar5) {
      *ec = U_BUFFER_OVERFLOW_ERROR;
      return iVar5;
    }
    *dest = (ushort)uVar10;
    if ((int)uVar12 < (int)uVar10) {
      *dest = (ushort)uVar10 | 0x8000;
      dest[1] = (uint16_t)uVar12;
      dest = dest + 1;
    }
    uVar3 = 0;
    uVar6 = 0;
    if (0 < (int)uVar12) {
      uVar3 = uVar12;
      uVar6 = uVar12;
    }
    while( true ) {
      puVar8 = dest + 1;
      if (uVar3 == 0) break;
      uVar1 = *puVar9;
      puVar9 = puVar9 + 2;
      *puVar8 = uVar1;
      dest = puVar8;
      uVar3 = uVar3 - 1;
    }
    for (lVar7 = 0; (int)(uVar6 + (int)lVar7) < (int)uVar10; lVar7 = lVar7 + 2) {
      uVar2 = *(undefined4 *)(puVar9 + lVar7);
      puVar8[lVar7] = (uint16_t)((uint)uVar2 >> 0x10);
      dest[lVar7 + 2] = (uint16_t)uVar2;
    }
  }
  return iVar5;
}

Assistant:

int32_t UnicodeSet::serialize(uint16_t *dest, int32_t destCapacity, UErrorCode& ec) const {
    int32_t bmpLength, length, destLength;

    if (U_FAILURE(ec)) {
        return 0;
    }

    if (destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        ec=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* count necessary 16-bit units */
    length=this->len-1; // Subtract 1 to ignore final UNICODESET_HIGH
    // assert(length>=0);
    if (length==0) {
        /* empty set */
        if (destCapacity>0) {
            *dest=0;
        } else {
            ec=U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }
    /* now length>0 */

    if (this->list[length-1]<=0xffff) {
        /* all BMP */
        bmpLength=length;
    } else if (this->list[0]>=0x10000) {
        /* all supplementary */
        bmpLength=0;
        length*=2;
    } else {
        /* some BMP, some supplementary */
        for (bmpLength=0; bmpLength<length && this->list[bmpLength]<=0xffff; ++bmpLength) {}
        length=bmpLength+2*(length-bmpLength);
    }
#ifdef DEBUG_SERIALIZE
    printf(">> bmpLength%d length%d len%d\n", bmpLength, length, len);
#endif
    /* length: number of 16-bit array units */
    if (length>0x7fff) {
        /* there are only 15 bits for the length in the first serialized word */
        ec=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    /*
     * total serialized length:
     * number of 16-bit array units (length) +
     * 1 length unit (always) +
     * 1 bmpLength unit (if there are supplementary values)
     */
    destLength=length+((length>bmpLength)?2:1);
    if (destLength<=destCapacity) {
        const UChar32 *p;
        int32_t i;

#ifdef DEBUG_SERIALIZE
        printf("writeHdr\n");
#endif
        *dest=(uint16_t)length;
        if (length>bmpLength) {
            *dest|=0x8000;
            *++dest=(uint16_t)bmpLength;
        }
        ++dest;

        /* write the BMP part of the array */
        p=this->list;
        for (i=0; i<bmpLength; ++i) {
#ifdef DEBUG_SERIALIZE
          printf("writebmp: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)*p++;
        }

        /* write the supplementary part of the array */
        for (; i<length; i+=2) {
#ifdef DEBUG_SERIALIZE
          printf("write32: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)(*p>>16);
            *dest++=(uint16_t)*p++;
        }
    } else {
        ec=U_BUFFER_OVERFLOW_ERROR;
    }
    return destLength;
}